

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetPropertyStr(JSContext *ctx,JSValue this_obj,char *prop)

{
  JSValue JVar1;
  JSAtom atom;
  JSValue ret;
  JSAtom in_stack_000000cc;
  JSContext *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  undefined1 in_stack_000000e8 [16];
  BOOL in_stack_00000170;
  JSAtom in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 local_10;
  
  JS_NewAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  JVar1 = JS_GetPropertyInternal
                    (in_stack_000000d0,(JSValue)in_stack_000000e8,in_stack_000000cc,
                     (JSValue)in_stack_000000d8,in_stack_00000170);
  local_10 = JVar1.u;
  JS_FreeAtom((JSContext *)local_10,in_stack_ffffffffffffff7c);
  return JVar1;
}

Assistant:

JSValue JS_GetPropertyStr(JSContext *ctx, JSValueConst this_obj,
                          const char *prop)
{
    JSAtom atom;
    JSValue ret;
    atom = JS_NewAtom(ctx, prop);
    ret = JS_GetProperty(ctx, this_obj, atom);
    JS_FreeAtom(ctx, atom);
    return ret;
}